

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendsig.c
# Opt level: O3

int32 duh_render_signal(DUH_SIGRENDERER *sigrenderer,float volume,float delta,int32 size,
                       sample_t_conflict **samples)

{
  sample_t_conflict *psVar1;
  sample_t_conflict *psVar2;
  uint uVar3;
  int32 iVar4;
  sample_t_conflict **samples_00;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  if (samples != (sample_t_conflict **)0x0) {
    samples_00 = allocate_sample_buffer(sigrenderer->n_channels,size);
    if (samples_00 == (sample_t_conflict **)0x0) {
      uVar3 = 0;
    }
    else {
      dumb_silence(*samples_00,sigrenderer->n_channels * size);
      uVar3 = duh_sigrenderer_generate_samples
                        (sigrenderer,(double)volume,(double)delta,size,samples_00);
      iVar6 = sigrenderer->n_channels;
      if (0 < iVar6) {
        lVar5 = 0;
        do {
          if (0 < (int)uVar3) {
            psVar1 = *samples_00;
            psVar2 = samples[lVar5];
            uVar7 = 0;
            do {
              psVar2[uVar7] =
                   psVar2[uVar7] + (psVar1[sigrenderer->n_channels * (int)uVar7 + (int)lVar5] >> 8);
              uVar7 = uVar7 + 1;
            } while (uVar3 != uVar7);
            iVar6 = sigrenderer->n_channels;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar6);
      }
      destroy_sample_buffer(samples_00);
    }
    return uVar3;
  }
  iVar4 = duh_sigrenderer_generate_samples
                    (sigrenderer,(double)volume,(double)delta,size,(sample_t_conflict **)0x0);
  return iVar4;
}

Assistant:

int32 duh_render_signal(
	DUH_SIGRENDERER *sigrenderer,
	float volume, float delta,
	int32 size, sample_t **samples
)
{
	sample_t **s;
	int32 rendered;
	int32 i;
	int j;
	if (!samples) return duh_sigrenderer_generate_samples(sigrenderer, volume, delta, size, NULL);
	s = allocate_sample_buffer(sigrenderer->n_channels, size);
	if (!s) return 0;
	dumb_silence(s[0], sigrenderer->n_channels * size);
	rendered = duh_sigrenderer_generate_samples(sigrenderer, volume, delta, size, s);
	for (j = 0; j < sigrenderer->n_channels; j++)
		for (i = 0; i < rendered; i++)
			samples[j][i] += s[0][i*sigrenderer->n_channels+j] >> 8;
	destroy_sample_buffer(s);
	return rendered;
}